

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

boolean_type * __thiscall
toml::basic_value<toml::type_config>::as_boolean(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == boolean) {
    return (boolean_type *)&this->field_1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_boolean()","");
  throw_bad_cast(this,&local_38,boolean);
}

Assistant:

boolean_type& as_boolean()
    {
        if(this->type_ != value_t::boolean)
        {
            this->throw_bad_cast("toml::value::as_boolean()", value_t::boolean);
        }
        return this->boolean_.value;
    }